

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

string_view __thiscall Jupiter::Socket::getData(Socket *this)

{
  Data *pDVar1;
  int iVar2;
  size_t sVar3;
  string_view sVar4;
  
  iVar2 = (*this->_vptr_Socket[8])();
  pDVar1 = this->m_data;
  if (iVar2 < 1) {
    (pDVar1->buffer).m_buffer_size = 0;
    sVar3 = 0;
  }
  else {
    sVar3 = (pDVar1->buffer).m_buffer_size;
  }
  sVar4._M_str = (char *)(pDVar1->buffer).m_buffer;
  sVar4._M_len = sVar3;
  return sVar4;
}

Assistant:

std::string_view Jupiter::Socket::getData() {
	if (this->recv() <= 0) {
		m_data->buffer.clear();
	}
	return m_data->buffer.view();
}